

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType0::operator==(GridDataType0 *this,GridDataType0 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if ((KVar1) ||
     (*(short *)&(this->super_GridData).field_0xc != *(short *)&(Value->super_GridData).field_0xc))
  {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&this->m_vui8DataVals,&Value->m_vui8DataVals);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL GridDataType0::operator == ( const GridDataType0 & Value ) const
{
    if( GridData::operator != ( Value ) )         return false;
    if( m_ui16NumBytes != Value.m_ui16NumBytes )  return false;
    if( m_vui8DataVals  != Value.m_vui8DataVals ) return false;
    return true;
}